

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

spv_result_t
spvtools::val::ValidateBinaryAndKeepValidationState
          (spv_const_context context,spv_const_validator_options options,uint32_t *words,
          size_t num_words,spv_diagnostic *pDiagnostic,
          unique_ptr<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
          *vstate)

{
  spv_result_t sVar1;
  ValidationState_t *this;
  spv_context_t hijack_context;
  
  spv_context_t::spv_context_t(&hijack_context,context);
  if (pDiagnostic != (spv_diagnostic *)0x0) {
    *pDiagnostic = (spv_diagnostic)0x0;
    UseDiagnosticAsMessageConsumer(&hijack_context,pDiagnostic);
  }
  this = (ValidationState_t *)::operator_new(0x728);
  ValidationState_t::ValidationState_t(this,&hijack_context,options,words,num_words,1);
  std::
  __uniq_ptr_impl<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
  ::reset((__uniq_ptr_impl<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
           *)vstate,this);
  sVar1 = anon_unknown_2::ValidateBinaryUsingContextAndValidationState
                    (&hijack_context,words,num_words,pDiagnostic,
                     (vstate->_M_t).
                     super___uniq_ptr_impl<spvtools::val::ValidationState_t,_std::default_delete<spvtools::val::ValidationState_t>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::val::ValidationState_t_*,_std::default_delete<spvtools::val::ValidationState_t>_>
                     .super__Head_base<0UL,_spvtools::val::ValidationState_t_*,_false>._M_head_impl)
  ;
  if (hijack_context.consumer.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*hijack_context.consumer.super__Function_base._M_manager)
              ((_Any_data *)&hijack_context.consumer,(_Any_data *)&hijack_context.consumer,
               __destroy_functor);
  }
  return sVar1;
}

Assistant:

spv_result_t ValidateBinaryAndKeepValidationState(
    const spv_const_context context, spv_const_validator_options options,
    const uint32_t* words, const size_t num_words, spv_diagnostic* pDiagnostic,
    std::unique_ptr<ValidationState_t>* vstate) {
  spv_context_t hijack_context = *context;
  if (pDiagnostic) {
    *pDiagnostic = nullptr;
    UseDiagnosticAsMessageConsumer(&hijack_context, pDiagnostic);
  }

  vstate->reset(new ValidationState_t(&hijack_context, options, words,
                                      num_words, kDefaultMaxNumOfWarnings));

  return ValidateBinaryUsingContextAndValidationState(
      hijack_context, words, num_words, pDiagnostic, vstate->get());
}